

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void action_red_cross_parcel(tgestate_t *state)

{
  state->item_structs[0xc].room_and_flags = '?';
  *(undefined1 *)
   ((long)state->jmpbuf_main[0].__jmpbuf + (((ulong)(state->items_held[0] == '\f') ^ 0x6e5) - 0x20))
       = 0xff;
  draw_all_items(state);
  drop_item_tail(state,state->red_cross_parcel_current_contents);
  queue_message(state,message_YOU_OPEN_THE_BOX);
  increase_morale_by_10_score_by_50(state);
  return;
}

Assistant:

void action_red_cross_parcel(tgestate_t *state)
{
  item_t *item; /* was HL */

  assert(state != NULL);

  state->item_structs[item_RED_CROSS_PARCEL].room_and_flags = room_NONE & itemstruct_ROOM_MASK;

  item = &state->items_held[0];
  if (*item != item_RED_CROSS_PARCEL)
    item++; /* One or the other must be a red cross parcel item, so advance. */
  *item = item_NONE; /* Parcel opened. */

  draw_all_items(state);

  drop_item_tail(state, state->red_cross_parcel_current_contents);

  queue_message(state, message_YOU_OPEN_THE_BOX);
  increase_morale_by_10_score_by_50(state);
}